

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::IsValid(ON_NurbsCage *this,ON_TextLog *param_1)

{
  uint uVar1;
  int local_3c;
  uint local_30;
  uint local_2c;
  int i [3];
  int cvdim;
  ON_TextLog *param_1_local;
  ON_NurbsCage *this_local;
  
  if (this->m_cv == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->m_knot[0] == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->m_knot[1] == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->m_knot[2] == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->m_order[0] < 2) {
    this_local._7_1_ = false;
  }
  else if (this->m_order[1] < 2) {
    this_local._7_1_ = false;
  }
  else if (this->m_order[2] < 2) {
    this_local._7_1_ = false;
  }
  else if (this->m_cv_count[0] < this->m_order[0]) {
    this_local._7_1_ = false;
  }
  else if (this->m_cv_count[1] < this->m_order[1]) {
    this_local._7_1_ = false;
  }
  else if (this->m_cv_count[2] < this->m_order[2]) {
    this_local._7_1_ = false;
  }
  else if (this->m_dim < 1) {
    this_local._7_1_ = false;
  }
  else if (((this->m_is_rat & 1U) == 0) || ((this->m_is_rat & 1U) == 1)) {
    if ((this->m_is_rat & 1U) == 0) {
      local_3c = this->m_dim;
    }
    else {
      local_3c = this->m_dim + 1;
    }
    if ((this->m_cv_capacity < 1) ||
       (local_3c * this->m_cv_count[0] * this->m_cv_count[1] * this->m_cv_count[2] <=
        this->m_cv_capacity)) {
      local_2c = (uint)(this->m_cv_stride[1] < this->m_cv_stride[0]);
      uVar1 = 1 - local_2c;
      i[0] = uVar1;
      if (this->m_cv_stride[2] < this->m_cv_stride[(int)local_2c]) {
        local_30 = 2;
      }
      else {
        local_30 = local_2c;
        if (this->m_cv_stride[2] < this->m_cv_stride[(int)uVar1]) {
          local_2c = 2;
        }
        else {
          i[0] = 2;
          local_2c = uVar1;
        }
      }
      if (this->m_cv_stride[(int)local_30] < local_3c) {
        this_local._7_1_ = false;
      }
      else if (this->m_cv_stride[(int)local_2c] <
               this->m_cv_stride[(int)local_30] * this->m_cv_count[(int)local_30]) {
        this_local._7_1_ = false;
      }
      else if (this->m_cv_stride[i[0]] <
               this->m_cv_stride[(int)local_2c] * this->m_cv_count[(int)local_2c]) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCage::IsValid( 
  ON_TextLog* //text_log 
) const
{
  if ( 0 == m_cv )
    return false;

  if ( 0 == m_knot[0] )
    return false;

  if ( 0 == m_knot[1] )
    return false;

  if ( 0 == m_knot[2] )
    return false;

  if ( m_order[0] < 2 )
    return false;
  if ( m_order[1] < 2 )
    return false;
  if ( m_order[2] < 2 )
    return false;

  if ( m_cv_count[0] < m_order[0] )
    return false;
  if ( m_cv_count[1] < m_order[1] )
    return false;
  if ( m_cv_count[2] < m_order[2] )
    return false;

  if ( m_dim <= 0 )
    return false;
  if ( m_is_rat != 0 && m_is_rat != 1 )
    return false;

  const int cvdim = m_is_rat ? (m_dim+1) : m_dim;

  if ( m_cv_capacity > 0 && m_cv_capacity < cvdim*m_cv_count[0]*m_cv_count[1]*m_cv_count[2] )
    return false;

  int i[3];
  i[0] = (m_cv_stride[0] <= m_cv_stride[1]) ? 0 : 1;
  i[1] = 1-i[0];
  if ( m_cv_stride[2] < m_cv_stride[i[0]] )
  {
    i[2] = i[1];
    i[1] = i[0];
    i[0] = 2;
  }
  else if ( m_cv_stride[2] < m_cv_stride[i[1]] )
  {
    i[2] = i[1];
    i[1] = 2;
  }
  else
  {
    i[2] = 2;
  }

  if ( m_cv_stride[i[0]] < cvdim )
    return false;
  if ( m_cv_stride[i[1]] < m_cv_stride[i[0]]*m_cv_count[i[0]] )
    return false;
  if ( m_cv_stride[i[2]] < m_cv_stride[i[1]]*m_cv_count[i[1]] )
    return false;

  return true;
}